

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O1

string * __thiscall
QPDFFormFieldObjectHelper::getInheritableFieldValueAsString
          (string *__return_storage_ptr__,QPDFFormFieldObjectHelper *this,string *name)

{
  bool bVar1;
  QPDFObjectHandle fv;
  QPDFObjectHandle QStack_48;
  string local_38;
  
  getInheritableFieldValue((QPDFFormFieldObjectHelper *)&QStack_48,(string *)this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = QPDFObjectHandle::isString(&QStack_48);
  if (bVar1) {
    QPDFObjectHandle::getUTF8Value_abi_cxx11_(&local_38,&QStack_48);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,(ulong)(local_38.field_2._M_allocated_capacity + 1))
      ;
    }
  }
  if ((element_type *)
      QStack_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (QStack_48.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFFormFieldObjectHelper::getInheritableFieldValueAsString(std::string const& name)
{
    QPDFObjectHandle fv = getInheritableFieldValue(name);
    std::string result;
    if (fv.isString()) {
        result = fv.getUTF8Value();
    }
    return result;
}